

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Int64Parameter::Int64Parameter(Int64Parameter *this,Int64Parameter *from)

{
  void *pvVar1;
  Int64Set *this_00;
  Int64Range *this_01;
  Int64Set *from_00;
  Int64Range *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64Parameter_003c2d10;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->defaultvalue_ = from->defaultvalue_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    this_01 = (Int64Range *)operator_new(0x28);
    Int64Range::Int64Range(this_01);
    (this->AllowedValues_).range_ = this_01;
    if (from->_oneof_case_[0] == 10) {
      from_01 = (from->AllowedValues_).range_;
    }
    else {
      from_01 = Int64Range::default_instance();
    }
    Int64Range::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    clear_AllowedValues(this);
    this->_oneof_case_[0] = 0xb;
    this_00 = (Int64Set *)operator_new(0x28);
    Int64Set::Int64Set(this_00);
    (this->AllowedValues_).set_ = this_00;
    if (from->_oneof_case_[0] == 0xb) {
      from_00 = (from->AllowedValues_).set_;
    }
    else {
      from_00 = Int64Set::default_instance();
    }
    Int64Set::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

Int64Parameter::Int64Parameter(const Int64Parameter& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  defaultvalue_ = from.defaultvalue_;
  clear_has_AllowedValues();
  switch (from.AllowedValues_case()) {
    case kRange: {
      mutable_range()->::CoreML::Specification::Int64Range::MergeFrom(from.range());
      break;
    }
    case kSet: {
      mutable_set()->::CoreML::Specification::Int64Set::MergeFrom(from.set());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Int64Parameter)
}